

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CWorker.hpp
# Opt level: O0

void __thiscall sftm::CWorker::DoWork(CWorker *this)

{
  bool bVar1;
  CTask *pTask_00;
  CTask *pTask;
  CWorker *this_local;
  
  do {
    while (pTask_00 = PopTask(this), pTask_00 != (CTask *)0x0) {
      ExecuteTask(this,pTask_00);
    }
    bVar1 = FindWork(this);
  } while (bVar1);
  return;
}

Assistant:

void DoWork() noexcept
		{
			do
			{
				while (CTask* pTask = PopTask())
				{
					ExecuteTask(pTask);
				}
			} while (FindWork());
		}